

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snake.cpp
# Opt level: O1

void __thiscall
Snake::UpdateBody(Snake *this,SDL_Point *current_head_cell,SDL_Point *prev_head_cell,
                 Snake *otherSnake)

{
  pointer *ppSVar1;
  int iVar2;
  int iVar3;
  iterator __position;
  pointer pSVar4;
  pointer pSVar5;
  SDL_Point *item;
  pointer pSVar6;
  
  __position._M_current =
       (this->body).super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->body).super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<SDL_Point,std::allocator<SDL_Point>>::_M_realloc_insert<SDL_Point_const&>
              ((vector<SDL_Point,std::allocator<SDL_Point>> *)&this->body,__position,prev_head_cell)
    ;
  }
  else {
    *__position._M_current = *prev_head_cell;
    ppSVar1 = &(this->body).super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  if (this->growing == false) {
    pSVar5 = (this->body).super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar4 = (this->body).super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pSVar6 = pSVar5 + 1;
    if (pSVar6 != pSVar4) {
      memmove(pSVar5,pSVar6,(long)pSVar4 - (long)pSVar6);
    }
    ppSVar1 = &(this->body).super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + -1;
  }
  else {
    this->growing = false;
    this->size = this->size + 1;
  }
  pSVar6 = (this->body).super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar5 = (this->body).super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar6 != pSVar5) {
    iVar2 = current_head_cell->x;
    iVar3 = current_head_cell->y;
    do {
      if ((iVar2 == pSVar6->x) && (iVar3 == pSVar6->y)) {
        this->alive = false;
      }
      pSVar6 = pSVar6 + 1;
    } while (pSVar6 != pSVar5);
  }
  pSVar6 = (otherSnake->body).super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar5 = (otherSnake->body).super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar6 != pSVar5) {
    iVar2 = current_head_cell->x;
    iVar3 = current_head_cell->y;
    do {
      if ((iVar2 == pSVar6->x) && (iVar3 == pSVar6->y)) {
        this->alive = false;
      }
      pSVar6 = pSVar6 + 1;
    } while (pSVar6 != pSVar5);
  }
  if ((current_head_cell->x == (int)otherSnake->head_x) &&
     (current_head_cell->y == (int)otherSnake->head_y)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"snakes collided",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
    std::ostream::put('\x18');
    std::ostream::flush();
    this->alive = false;
  }
  return;
}

Assistant:

void Snake::UpdateBody(SDL_Point &current_head_cell, SDL_Point &prev_head_cell, Snake otherSnake) {
  // Add previous head location to vector
  body.push_back(prev_head_cell);

  if (!growing) {
    // Remove the tail from the vector.
    body.erase(body.begin());
  } else {
    growing = false;
    size++;
  }
  
  // Check if the snake has died.
  /*hiiting himself*/
  for (auto const &item : body) {
    if (current_head_cell.x == static_cast<int>(item.x) && current_head_cell.y == static_cast<int>(item.y)) {
      alive = false;
    }
  }
  
  /*hiiting otherSanke's body*/
  for (auto const &item : otherSnake.body) {
   if (current_head_cell.x == item.x && current_head_cell.y == item.y) {
      alive = false;
    }
  }
  
  /*hiiting otherSanke's head*/
  if (current_head_cell.x == static_cast<int>(otherSnake.head_x) && current_head_cell.y == static_cast<int>(otherSnake.head_y)) {
      std::cout << "snakes collided" << std::endl;
      alive = false;
  }
}